

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MapFieldBase::LookupMapValueNoSync
          (MapFieldBase *this,MapKey *map_key,MapValueConstRef *val)

{
  bool bVar1;
  UntypedMapBase *this_00;
  UntypedMapBase *map;
  MapValueConstRef *val_local;
  MapKey *map_key_local;
  MapFieldBase *this_local;
  
  map = (UntypedMapBase *)val;
  val_local = (MapValueConstRef *)map_key;
  map_key_local = (MapKey *)this;
  this_00 = MapFieldBaseForParse::GetMapRaw(&this->super_MapFieldBaseForParse);
  bVar1 = UntypedMapBase::empty(this_00);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         VisitMapKey<google::protobuf::internal::UntypedMapBase_const,google::protobuf::internal::MapFieldBase::LookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueConstRef*)const::__0>
                   ((MapKey *)val_local,this_00,(anon_class_8_1_ba1d8281)&map);
  }
  return this_local._7_1_;
}

Assistant:

bool MapFieldBase::LookupMapValueNoSync(const MapKey& map_key,
                                        MapValueConstRef* val) const {
  auto& map = GetMapRaw();
  if (map.empty()) return false;

  return VisitMapKey(map_key, map, [&](auto& map, const auto& key) {
    auto res = map.FindHelper(key);
    if (res.node == nullptr) {
      return false;
    }
    if (val != nullptr) {
      val->SetValue(map.GetVoidValue(res.node));
    }
    return true;
  });
}